

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  cmExportSet *pcVar1;
  pointer ppcVar2;
  cmTargetExport *pcVar3;
  cmInstallTargetGenerator *pcVar4;
  cmTarget *this_00;
  TargetType TVar5;
  size_t sVar6;
  ostream *poVar7;
  pointer ppcVar8;
  long lVar9;
  bool bVar10;
  allocator<char> local_d1;
  string dest;
  string path;
  string installDir;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&installDir,
             (string *)
             &(((this->super_cmExportInstallFileGenerator).IEGen)->super_cmInstallGenerator).
              Destination);
  std::operator<<(os,"LOCAL_PATH := $(call my-dir)\n");
  sVar6 = cmsys::SystemTools::CountChar(installDir._M_dataplus._M_p,'/');
  lVar9 = (sVar6 + 1) - (ulong)(installDir._M_string_length == 0);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
    std::__cxx11::string::append((char *)&path);
  }
  poVar7 = std::operator<<(os,"_IMPORT_PREFIX := ");
  poVar7 = std::operator<<(poVar7,"$(LOCAL_PATH)");
  poVar7 = std::operator<<(poVar7,(string *)&path);
  std::operator<<(poVar7,"\n\n");
  pcVar1 = ((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet;
  ppcVar2 = (pcVar1->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar8 = (pcVar1->TargetExports).
                 super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar8 != ppcVar2; ppcVar8 = ppcVar8 + 1) {
    pcVar3 = *ppcVar8;
    TVar5 = cmGeneratorTarget::GetType(pcVar3->Target);
    if (TVar5 != INTERFACE_LIBRARY) {
      dest._M_dataplus._M_p = (pointer)&dest.field_2;
      dest._M_string_length = 0;
      dest.field_2._M_local_buf[0] = '\0';
      pcVar4 = pcVar3->LibraryGenerator;
      if (pcVar4 != (cmInstallTargetGenerator *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_d1);
        cmInstallTargetGenerator::GetDestination(&local_50,pcVar4,&local_70);
        std::__cxx11::string::operator=((string *)&dest,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      pcVar4 = pcVar3->ArchiveGenerator;
      if (pcVar4 != (cmInstallTargetGenerator *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_d1);
        cmInstallTargetGenerator::GetDestination(&local_50,pcVar4,&local_70);
        std::__cxx11::string::operator=((string *)&dest,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      this_00 = pcVar3->Target->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"__dest",(allocator<char> *)&local_70);
      cmTarget::SetProperty(this_00,&local_50,dest._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&dest);
    }
  }
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&installDir);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := "
     << "$(LOCAL_PATH)" << path << "\n\n";
  for (cmTargetExport* te : *this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest.c_str());
  }
}